

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.h
# Opt level: O3

void __thiscall lumeview::Shader::add_source(Shader *this,string *filename,GLenum shaderType)

{
  iterator iVar1;
  GLuint GVar2;
  ostream *poVar3;
  size_t sVar4;
  LumeviewError *this_00;
  element_type *peVar5;
  int success;
  uint shader;
  char *shaderSrcCStr;
  string shaderSrc;
  stringstream ss;
  char infoLog [512];
  uint local_404;
  int local_400;
  GLuint local_3fc;
  pointer local_3f8;
  string local_3f0;
  string local_3d0;
  stringstream local_3b0 [16];
  ostream local_3a0 [376];
  GLchar local_228 [520];
  
  local_404 = shaderType;
  if (((this->m_shaderData).
       super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_shaderProg == 0) {
    GVar2 = (*glad_glCreateProgram)();
    ((this->m_shaderData).
     super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_shaderProg = GVar2;
  }
  LoadStringFromFile(&local_3f0,filename);
  local_3f8 = local_3f0._M_dataplus._M_p;
  GVar2 = (*glad_glCreateShader)(shaderType);
  local_3fc = GVar2;
  (*glad_glShaderSource)(GVar2,1,&local_3f8,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&local_400);
  if (local_400 != 0) {
    (*glad_glAttachShader)
              (((this->m_shaderData).
                super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_shaderProg,GVar2);
    peVar5 = (this->m_shaderData).
             super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar5->m_linked = false;
    iVar1._M_current =
         (peVar5->m_shaders).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (peVar5->m_shaders).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&peVar5->m_shaders,iVar1,
                 &local_3fc);
      peVar5 = (this->m_shaderData).
               super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      *iVar1._M_current = GVar2;
      (peVar5->m_shaders).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&peVar5->m_shaderNames,filename);
    peVar5 = (this->m_shaderData).
             super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar1._M_current =
         (peVar5->m_shaderTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (peVar5->m_shaderTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&peVar5->m_shaderTypes,iVar1,
                 &local_404);
    }
    else {
      *iVar1._M_current = local_404;
      (peVar5->m_shaderTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  (*glad_glGetShaderInfoLog)(GVar2,0x200,(GLsizei *)0x0,local_228);
  std::__cxx11::stringstream::stringstream(local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_3a0,"SHADER::COMPILATION_FAILED in \'",0x1f);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_3a0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
  sVar4 = strlen(local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_228,sVar4);
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_3d0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

void add_source (std::string filename, GLenum shaderType) {
		if (!data().m_shaderProg)
			data().m_shaderProg = glCreateProgram ();

	//	load the sources from a file
		std::string shaderSrc = LoadStringFromFile (filename);
		const char* shaderSrcCStr = shaderSrc.c_str();

	//	create the shader object and compile the sources
		uint shader;
		shader = glCreateShader (shaderType);
		glShaderSource (shader, 1, &shaderSrcCStr, NULL);
		glCompileShader (shader);

	//	check for errors
		int success;
		glGetShaderiv (shader, GL_COMPILE_STATUS, &success);
		if (!success) {
			char infoLog[512];
			glGetShaderInfoLog (shader, 512, NULL, infoLog);
			THROW("SHADER::COMPILATION_FAILED in '" << filename << "'\n" << infoLog);
		}

		glAttachShader (data().m_shaderProg, shader);
		data().m_linked = false;
		data().m_shaders.push_back (shader);
		data().m_shaderNames.push_back (filename);
		data().m_shaderTypes.push_back (shaderType);
	}